

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extprivkey.cpp
# Opt level: O0

void __thiscall
ExtPrivkey_SerializeConstructorTest_Test::~ExtPrivkey_SerializeConstructorTest_Test
          (ExtPrivkey_SerializeConstructorTest_Test *this)

{
  ExtPrivkey_SerializeConstructorTest_Test *this_local;
  
  ~ExtPrivkey_SerializeConstructorTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ExtPrivkey, SerializeConstructorTest) {
  std::string ext_serial = "0488ade4042da711a50000000028009126a24557d32ff2c5da21850dd06529f34faed53b4a3552b5ed4bda35d50073a2361673d25f998d1e9d94aabdeba8ac1ddd4628bc4f55341397d263bd560c";
  ExtPrivkey extkey = ExtPrivkey(ByteData(ext_serial));

  EXPECT_STREQ(ext_serial.c_str(), extkey.GetData().GetHex().c_str());
  EXPECT_EQ(extprivkey_kVersionMainnetPrivkey, extkey.GetVersion());
  EXPECT_STREQ("0488ade4", extkey.GetVersionData().GetHex().c_str());
  EXPECT_TRUE(extkey.IsValid());
  EXPECT_STREQ("xprv9zt1onyw8BdEf7SQ6wUVH3bQQdGD9iy9QzXveQQRhX7i5iUN7jZgLbqFEe491LfjozztYa6bJAGZ65GmDCNcbjMdjZcgmdisPJwVjcfcDhV", extkey.ToString().c_str());
  EXPECT_EQ(4, extkey.GetDepth());
  EXPECT_STREQ("73a2361673d25f998d1e9d94aabdeba8ac1ddd4628bc4f55341397d263bd560c", extkey.GetPrivkey().GetHex().c_str());

  std::string pubkey_serial = "043587cf02f4a831a200000000bdc76da475a6fbdc4f3758939ab2096d4ab53b7d66c0eed66fc0f4be242835fc030061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c0";
  EXPECT_THROW((extkey = ExtPrivkey(ByteData(pubkey_serial))), CfdException);
}